

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O3

void __thiscall PDFDate::SetToCurrentTime(PDFDate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  EUTCRelation EVar8;
  tm *ptVar9;
  time_t __time1;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  time_t localEpoch;
  time_t currentTime;
  time_t local_20;
  time_t local_18;
  
  time(&local_18);
  ptVar9 = localtime(&local_18);
  uVar1 = ptVar9->tm_mon;
  uVar2 = ptVar9->tm_year;
  iVar4 = ptVar9->tm_sec;
  iVar5 = ptVar9->tm_min;
  iVar6 = ptVar9->tm_hour;
  iVar7 = ptVar9->tm_mday;
  this->Year = uVar2 + 0x76c;
  this->Month = uVar1 + 1;
  this->Day = iVar7;
  this->Hour = iVar6;
  this->Minute = iVar5;
  this->Second = iVar4;
  local_20 = time((time_t *)0x0);
  ptVar9 = gmtime(&local_20);
  ptVar9->tm_isdst = -1;
  __time1 = mktime(ptVar9);
  dVar12 = difftime(__time1,local_20);
  uVar10 = (ulong)dVar12;
  if (uVar10 == 0) {
    EVar8 = eSame;
  }
  else {
    uVar11 = -uVar10;
    if (0 < (long)uVar10) {
      uVar11 = uVar10;
    }
    auVar3 = SEXT816((long)(uVar11 % 0xe10)) * ZEXT816(0x8888888888888889);
    EVar8 = (EUTCRelation)((long)uVar10 < 1);
    this->HourFromUTC = (int)(uVar11 / 0xe10);
    this->MinuteFromUTC = (int)(auVar3._8_8_ >> 5) - (auVar3._12_4_ >> 0x1f);
  }
  this->UTC = EVar8;
  return;
}

Assistant:

void PDFDate::SetToCurrentTime()
{
	time_t currentTime;
	tm structuredLocalTime;
	long timeZoneSecondsDifference;

	time(&currentTime);
	SAFE_LOCAL_TIME(structuredLocalTime,currentTime);

	Year = structuredLocalTime.tm_year + 1900;
	Month = structuredLocalTime.tm_mon + 1;
	Day = structuredLocalTime.tm_mday;
	Hour = structuredLocalTime.tm_hour;
	Minute = structuredLocalTime.tm_min;
	Second = structuredLocalTime.tm_sec;

	// if unsuccesful or method unknown don't provide UTC info (currently only knows for WIN32 and OSX
#if defined (__MWERKS__) || defined (__GNUC__)  || defined(_AIX32) || defined(WIN32)
	int status;
#if !defined(__MWERKS__) // (using c methods)
	struct tm *gmTime;

	time_t localEpoch, gmEpoch;

	/*First get local epoch time*/
	localEpoch = time(NULL);

	/* Using local time epoch get the GM Time */
	gmTime = gmtime(&localEpoch);
	gmTime->tm_isdst = -1;
	/* Convert gm time in to epoch format */
	gmEpoch = mktime(gmTime);

	timeZoneSecondsDifference =difftime(gmEpoch, localEpoch);
	status = 0;
#else // __MWERKS__ (using OSX methods)
	CFTimeZoneRef tzRef = ::CFTimeZoneCopySystem();
	if (tzRef)
	{
		CFTimeInterval intervalFromGMT = ::CFTimeZoneGetSecondsFromGMT(tzRef, currentTime);
		::CFRelease(tzRef);
		timeZoneSecondsDifference = intervalFromGMT;
		status = 0;
	}
	else
		status = -1;
#endif

	if(0 == status)
	{
		if(0 == timeZoneSecondsDifference)
		{
			UTC = eSame;
		}
		else
		{
			UTC = timeZoneSecondsDifference > 0 ? eEarlier : eLater;
			HourFromUTC = (int)(labs(timeZoneSecondsDifference) / 3600);
			MinuteFromUTC = (int)((labs(timeZoneSecondsDifference) - (labs(timeZoneSecondsDifference) / 3600)*3600) / 60);
		}
	}
	else
	{
		UTC = eUndefined;
		TRACE_LOG("PDFDate::SetToCurrentTime, Couldn't get UTC.");
	}

#else
	UTC = eUndefined;
#endif
}